

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

int whisper_decode_with_state
              (whisper_context *ctx,whisper_state *state,whisper_token *tokens,int n_tokens,
              int n_past,int n_threads)

{
  bool bVar1;
  int p1;
  
  p1 = n_past;
  whisper_batch_prep_legacy(&state->batch,tokens,n_tokens,n_past,n_past);
  whisper_kv_cache_seq_rm(&state->kv_self,0,n_past,p1);
  bVar1 = whisper_decode_internal
                    (ctx,state,&state->batch,n_threads,false,(ggml_abort_callback)0x0,(void *)0x0);
  if (!bVar1) {
    whisper_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to eval\n","whisper_decode_with_state");
  }
  return (uint)!bVar1;
}

Assistant:

int whisper_decode_with_state(struct whisper_context * ctx, struct whisper_state * state, const whisper_token * tokens, int n_tokens, int n_past, int n_threads) {
    whisper_batch_prep_legacy(state->batch, tokens, n_tokens, n_past, 0);

    whisper_kv_cache_seq_rm(state->kv_self, 0, n_past, -1);

    if (!whisper_decode_internal(*ctx, *state, state->batch, n_threads, false, nullptr, nullptr)) {
        WHISPER_LOG_ERROR("%s: failed to eval\n", __func__);
        return 1;
    }

    return 0;
}